

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.h
# Opt level: O2

void __thiscall
aeron::ClientConductor::ExclusivePublicationStateDefn::ExclusivePublicationStateDefn
          (ExclusivePublicationStateDefn *this,string *channel,int64_t registrationId,
          int32_t streamId,longlong now)

{
  std::__cxx11::string::string((string *)this,(string *)channel);
  this->m_registrationId = registrationId;
  this->m_streamId = streamId;
  this->m_sessionId = -1;
  this->m_publicationLimitCounterId = -1;
  this->m_channelStatusId = -1;
  this->m_timeOfRegistration = now;
  this->m_status = AWAITING_MEDIA_DRIVER;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  (this->m_errorMessage)._M_string_length = 0;
  (this->m_errorMessage).field_2._M_local_buf[0] = '\0';
  (this->m_buffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_buffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_publication).super___weak_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_publication).super___weak_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

ExclusivePublicationStateDefn(
            const std::string& channel, std::int64_t registrationId, std::int32_t streamId, long long now) :
            m_channel(channel),
            m_registrationId(registrationId),
            m_streamId(streamId),
            m_timeOfRegistration(now)
        {
        }